

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O2

Fl_Widget * __thiscall Fl_Tabs::which(Fl_Tabs *this,int event_x,int event_y)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  Fl_Widget *pFVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((this->super_Fl_Group).children_ != 0) {
    iVar3 = tab_height(this);
    iVar5 = (this->super_Fl_Group).super_Fl_Widget.y_;
    if (iVar3 < 0) {
      iVar5 = iVar5 + (this->super_Fl_Group).super_Fl_Widget.h_;
      if (event_y < iVar5 + iVar3 || iVar5 < event_y) {
        return (Fl_Widget *)0x0;
      }
    }
    else if (event_y < iVar5 || iVar3 + iVar5 < event_y) {
      return (Fl_Widget *)0x0;
    }
    if ((this->super_Fl_Group).super_Fl_Widget.x_ <= event_x) {
      uVar1 = (this->super_Fl_Group).children_;
      tab_positions(this);
      uVar6 = 0;
      uVar7 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar7 = uVar6;
      }
      while (uVar7 != uVar6) {
        lVar2 = uVar6 + 1;
        uVar6 = uVar6 + 1;
        if (event_x < this->tab_pos[lVar2] + (this->super_Fl_Group).super_Fl_Widget.x_) {
          pFVar4 = Fl_Group::child(&this->super_Fl_Group,(int)uVar6 + -1);
          return pFVar4;
        }
      }
    }
  }
  return (Fl_Widget *)0x0;
}

Assistant:

Fl_Widget *Fl_Tabs::which(int event_x, int event_y) {
  if (children() == 0) return 0;
  int H = tab_height();
  if (H < 0) {
    if (event_y > y()+h() || event_y < y()+h()+H) return 0;
  } else {
    if (event_y > y()+H || event_y < y()) return 0;
  }
  if (event_x < x()) return 0;
  Fl_Widget *ret = 0L;
  const int nc = children();
  tab_positions();
  for (int i=0; i<nc; i++) {
    if (event_x < x()+tab_pos[i+1]) {
      ret = child(i);
      break;
    }
  }
  return ret;
}